

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O3

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenerateStructGetters
          (KotlinKMPGenerator *this,StructDef *struct_def,CodeWriter *writer)

{
  _Manager_type p_Var1;
  BaseType BVar2;
  FieldDef *field;
  pointer ppFVar3;
  FieldDef *pFVar4;
  StructDef *pSVar5;
  long *plVar6;
  mapped_type *pmVar7;
  pointer ppFVar8;
  unsigned_long t;
  BaseType BVar9;
  _Base_ptr p_Var10;
  CodeWriter *pCVar11;
  _Manager_type *pp_Var12;
  string *psVar13;
  _Manager_type p_Var14;
  Value *pVVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string params;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> rtype;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> param2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> offset_prefix;
  string field_name;
  string return_type;
  string field_type;
  string offset_val;
  string field_default_value;
  FieldDef *key_field;
  string bbgetter;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> fields_vec;
  _Any_data local_298;
  EnumDef *pEStack_288;
  code *local_280;
  _Alloc_hider local_278;
  StructDef *local_270;
  undefined1 auStack_268 [16];
  CodeWriter *local_258;
  _Any_data local_250;
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  undefined1 local_220 [16];
  _Any_data local_210;
  code *local_200;
  code *pcStack_1f8;
  KotlinKMPGenerator *local_1f0;
  _Base_ptr local_1e8;
  _Base_ptr local_1e0;
  undefined1 local_1d8 [16];
  string local_1c8;
  _Any_data local_1a8;
  _Manager_type local_198;
  code *pcStack_190;
  _Any_data local_188;
  code *local_178;
  code *local_170;
  string local_168;
  StructDef *local_148;
  undefined1 local_140 [32];
  string local_120;
  pointer local_100;
  undefined1 local_f8 [32];
  FieldDef *local_d8;
  string local_d0;
  _Alloc_hider local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  string *local_90;
  undefined1 local_88 [24];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_258 = writer;
  local_148 = struct_def;
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::vector
            ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)local_88,
             &(struct_def->fields).vec);
  local_d8 = (FieldDef *)0x0;
  if (local_88._0_8_ != local_88._8_8_) {
    local_100 = (pointer)&this->namer_;
    psVar13 = (string *)local_88._0_8_;
    local_1f0 = this;
    do {
      field = (FieldDef *)(psVar13->_M_dataplus)._M_p;
      if (field->deprecated == false) {
        if (field->key == true) {
          local_d8 = field;
        }
        GenerateComment(this,&(field->super_Definition).doc_comment,local_258,
                        (CommentConfig *)(anonymous_namespace)::comment_config);
        (*((Namer *)&local_100->_M_dataplus)->_vptr_Namer[0x12])(local_1d8 + 0x10,local_100,field);
        pVVar15 = &field->value;
        GenTypeGet_abi_cxx11_(&local_168,this,&pVVar15->type);
        GenDefaultValue_abi_cxx11_((string *)(local_140 + 0x20),this,field);
        local_90 = psVar13;
        GetterReturnType_abi_cxx11_((string *)&local_188,this,field);
        local_d0._M_dataplus._M_p = (pointer)(&local_d0._M_dataplus + 2);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"bb","");
        ByteBufferGetter((string *)&local_b0,this,&pVVar15->type,&local_d0);
        if ((_Alloc_hider *)local_d0._M_dataplus._M_p != &local_d0._M_dataplus + 2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        NumToString<unsigned_short>((string *)local_140,(field->value).offset);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_298,"val o = offset(",(string *)local_140);
        plVar6 = (long *)std::__cxx11::string::append(local_298._M_pod_data);
        p_Var10 = (_Base_ptr)(plVar6 + 2);
        if ((_Base_ptr)*plVar6 == p_Var10) {
          local_1d8._0_8_ = *(undefined8 *)p_Var10;
          local_1d8._8_8_ = plVar6[3];
          local_1e8 = (_Base_ptr)local_1d8;
        }
        else {
          local_1d8._0_8_ = *(undefined8 *)p_Var10;
          local_1e8 = (_Base_ptr)*plVar6;
        }
        local_1e0 = (_Base_ptr)plVar6[1];
        *plVar6 = (long)p_Var10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((CodeWriter *)local_298._M_unused._0_8_ != (CodeWriter *)&pEStack_288) {
          operator_delete(local_298._M_unused._M_object,
                          (ulong)((long)&(pEStack_288->super_Definition).name._M_dataplus._M_p + 1))
          ;
        }
        BVar2 = (pVVar15->type).base_type;
        local_298._M_unused._M_object = (CodeWriter *)&pEStack_288;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"offset","");
        NumToString<unsigned_short>((string *)&local_278,(field->value).offset);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&local_258->value_map_,(key_type *)&local_298);
        std::__cxx11::string::_M_assign((string *)pmVar7);
        if ((CodeWriter *)local_278._M_p != (CodeWriter *)auStack_268) {
          operator_delete(local_278._M_p,(ulong)(auStack_268._0_8_ + 1));
        }
        if ((CodeWriter *)local_298._M_unused._0_8_ != (CodeWriter *)&pEStack_288) {
          operator_delete(local_298._M_unused._M_object,
                          (ulong)((long)&(pEStack_288->super_Definition).name._M_dataplus._M_p + 1))
          ;
        }
        local_298._M_unused._M_object = (CodeWriter *)&pEStack_288;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"return_type","");
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&local_258->value_map_,(key_type *)&local_298);
        std::__cxx11::string::_M_assign((string *)pmVar7);
        if ((CodeWriter *)local_298._M_unused._0_8_ != (CodeWriter *)&pEStack_288) {
          operator_delete(local_298._M_unused._M_object,
                          (ulong)((long)&(pEStack_288->super_Definition).name._M_dataplus._M_p + 1))
          ;
        }
        local_298._M_unused._M_object = (CodeWriter *)&pEStack_288;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"field_type","");
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&local_258->value_map_,(key_type *)&local_298);
        std::__cxx11::string::_M_assign((string *)pmVar7);
        if ((CodeWriter *)local_298._M_unused._0_8_ != (CodeWriter *)&pEStack_288) {
          operator_delete(local_298._M_unused._M_object,
                          (ulong)((long)&(pEStack_288->super_Definition).name._M_dataplus._M_p + 1))
          ;
        }
        local_298._M_unused._M_object = (CodeWriter *)&pEStack_288;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"field_name","");
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&local_258->value_map_,(key_type *)&local_298);
        std::__cxx11::string::_M_assign((string *)pmVar7);
        if ((CodeWriter *)local_298._M_unused._0_8_ != (CodeWriter *)&pEStack_288) {
          operator_delete(local_298._M_unused._M_object,
                          (ulong)((long)&(pEStack_288->super_Definition).name._M_dataplus._M_p + 1))
          ;
        }
        local_298._M_unused._M_object = (CodeWriter *)&pEStack_288;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"field_default","");
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&local_258->value_map_,(key_type *)&local_298);
        std::__cxx11::string::_M_assign((string *)pmVar7);
        if ((CodeWriter *)local_298._M_unused._0_8_ != (CodeWriter *)&pEStack_288) {
          operator_delete(local_298._M_unused._M_object,
                          (ulong)((long)&(pEStack_288->super_Definition).name._M_dataplus._M_p + 1))
          ;
        }
        local_298._M_unused._M_object = (CodeWriter *)&pEStack_288;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"bbgetter","");
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&local_258->value_map_,(key_type *)&local_298);
        std::__cxx11::string::_M_assign((string *)pmVar7);
        if ((CodeWriter *)local_298._M_unused._0_8_ != (CodeWriter *)&pEStack_288) {
          operator_delete(local_298._M_unused._M_object,
                          (ulong)((long)&(pEStack_288->super_Definition).name._M_dataplus._M_p + 1))
          ;
        }
        if (BVar2 == BASE_TYPE_VECTOR) {
          if ((field->value).type.element == BASE_TYPE_STRUCT) {
            local_298._M_unused._M_object = (CodeWriter *)&pEStack_288;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"j: Int","");
            local_270 = (StructDef *)0x0;
            local_278._M_p = (pointer)local_258;
            auStack_268._8_8_ =
                 std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1042:71)>
                 ::_M_invoke;
            auStack_268._0_8_ =
                 std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1042:71)>
                 ::_M_manager;
            GenerateFunOneLine(local_258,(string *)(local_1d8 + 0x10),(string *)&local_298,
                               (string *)&local_188,(function<void_()> *)&local_278,false);
            if ((EnumDef *)auStack_268._0_8_ != (EnumDef *)0x0) {
              (*(code *)auStack_268._0_8_)((string *)&local_278,(string *)&local_278,3);
            }
            if ((CodeWriter *)local_298._M_unused._0_8_ != (CodeWriter *)&pEStack_288) {
              operator_delete(local_298._M_unused._M_object,
                              (ulong)((long)&(pEStack_288->super_Definition).name._M_dataplus._M_p +
                                     1));
            }
          }
switchD_001ed71b_caseD_e:
          local_298._4_4_ = 0;
          local_298._0_4_ = (field->value).type.element;
          local_298._8_8_ = (field->value).type.struct_def;
          pEStack_288 = (field->value).type.enum_def;
          local_280 = (code *)CONCAT62(local_280._2_6_,(field->value).type.fixed_length);
          local_278._M_p = auStack_268;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"j: Int","");
          if (local_298._0_4_ - 0xf < 2) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_230,"obj: ",&local_168);
            plVar6 = (long *)std::__cxx11::string::append((char *)local_230);
            pCVar11 = (CodeWriter *)(plVar6 + 2);
            if ((CodeWriter *)*plVar6 == pCVar11) {
              local_240._0_8_ = *(undefined8 *)&(pCVar11->value_map_)._M_t._M_impl;
              local_240._8_8_ = plVar6[3];
              local_250._M_unused._M_object = (CodeWriter *)local_240;
            }
            else {
              local_240._0_8_ = *(undefined8 *)&(pCVar11->value_map_)._M_t._M_impl;
              local_250._M_unused._M_object = (CodeWriter *)*plVar6;
            }
            local_250._8_8_ = plVar6[1];
            *plVar6 = (long)pCVar11;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_278,(string *)local_250._M_pod_data);
            if ((CodeWriter *)local_250._M_unused._0_8_ != (CodeWriter *)local_240) {
              operator_delete(local_250._M_unused._M_object,(ulong)(local_240._0_8_ + 1));
            }
            if ((undefined1 *)local_230._0_8_ != local_220) {
              operator_delete((void *)local_230._0_8_,(ulong)(local_220._0_8_ + 1));
            }
          }
          local_250._8_8_ = (_Base_ptr)0x0;
          local_250._M_unused._M_object = operator_new(0x18);
          *(_Any_data **)local_250._M_unused._0_8_ = &local_298;
          ((_Base_ptr)local_250._M_unused._0_8_)->_M_parent = (_Base_ptr)local_258;
          ((_Base_ptr)local_250._M_unused._0_8_)->_M_left = (_Base_ptr)local_140;
          local_240._8_8_ =
               std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1128:73)>
               ::_M_invoke;
          local_240._0_8_ =
               std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1128:73)>
               ::_M_manager;
          GenerateFunOneLine(local_258,(string *)(local_1d8 + 0x10),(string *)&local_278,
                             (string *)&local_188,(function<void_()> *)&local_250,false);
          if ((code *)local_240._0_8_ != (code *)0x0) {
            (*(code *)local_240._0_8_)(&local_250,&local_250,3);
          }
          if (local_278._M_p != auStack_268) {
            operator_delete(local_278._M_p,(ulong)(auStack_268._0_8_ + 1));
          }
          local_298._M_unused._M_object = (CodeWriter *)&pEStack_288;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_298,local_1c8._M_dataplus._M_p,
                     (long)(_Rb_tree_color *)local_1c8._M_string_length + local_1c8._M_dataplus._M_p
                    );
          std::__cxx11::string::append(local_298._M_pod_data);
          local_278._M_p = auStack_268;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"Int","");
          local_250._M_unused._M_object = local_258;
          local_250._8_8_ = local_140;
          local_240._8_8_ =
               std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1171:69)>
               ::_M_invoke;
          local_240._0_8_ =
               std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1171:69)>
               ::_M_manager;
          GenerateGetterOneLine
                    (local_258,(string *)&local_298,(string *)&local_278,
                     (function<void_()> *)&local_250);
          if ((code *)local_240._0_8_ != (code *)0x0) {
            (*(code *)local_240._0_8_)(&local_250,&local_250,3);
          }
          if ((CodeWriter *)local_278._M_p != (CodeWriter *)auStack_268) {
            operator_delete(local_278._M_p,(ulong)(auStack_268._0_8_ + 1));
          }
          if ((CodeWriter *)local_298._M_unused._0_8_ != (CodeWriter *)&pEStack_288) {
            operator_delete(local_298._M_unused._M_object,
                            (ulong)((long)&(pEStack_288->super_Definition).name._M_dataplus._M_p + 1
                                   ));
          }
          BVar9 = (field->value).type.element;
          if (BVar9 == BASE_TYPE_STRUCT) {
            pSVar5 = (field->value).type.struct_def;
            if (pSVar5->fixed == false) {
              ppFVar8 = (pSVar5->fields).vec.
                        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              ppFVar3 = (pSVar5->fields).vec.
                        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              if (ppFVar8 != ppFVar3) {
                do {
                  pFVar4 = *ppFVar8;
                  if (pFVar4->key == true) {
                    local_278._M_p = auStack_268;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"");
                    TypeInNameSpace((string *)&local_298,local_1f0,&pSVar5->super_Definition,
                                    (string *)&local_278);
                    if ((CodeWriter *)local_278._M_p != (CodeWriter *)auStack_268) {
                      operator_delete(local_278._M_p,(ulong)(auStack_268._0_8_ + 1));
                    }
                    local_250._M_unused._M_object = local_240;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"ByKey","")
                    ;
                    (*((Namer *)&local_100->_M_dataplus)->_vptr_Namer[3])
                              ((string *)&local_278,local_100,field,&local_250);
                    if ((_Base_ptr)local_250._M_unused._0_8_ != (_Base_ptr)local_240) {
                      operator_delete(local_250._M_unused._M_object,(ulong)(local_240._0_8_ + 1));
                    }
                    pVVar15 = &pFVar4->value;
                    GenTypeGet_abi_cxx11_((string *)local_230,local_1f0,&pVVar15->type);
                    plVar6 = (long *)std::__cxx11::string::replace
                                               ((ulong)local_230,0,(char *)0x0,0x36768e);
                    local_250._M_unused._M_object = local_240;
                    pCVar11 = (CodeWriter *)(plVar6 + 2);
                    if ((CodeWriter *)*plVar6 == pCVar11) {
                      local_240._0_8_ = *(undefined8 *)&(pCVar11->value_map_)._M_t._M_impl;
                      local_240._8_8_ = plVar6[3];
                    }
                    else {
                      local_240._0_8_ = *(undefined8 *)&(pCVar11->value_map_)._M_t._M_impl;
                      local_250._M_unused._M_object = (CodeWriter *)*plVar6;
                    }
                    local_250._8_8_ = plVar6[1];
                    *plVar6 = (long)pCVar11;
                    plVar6[1] = 0;
                    *(undefined1 *)(plVar6 + 2) = 0;
                    if ((undefined1 *)local_230._0_8_ != local_220) {
                      operator_delete((void *)local_230._0_8_,(ulong)(local_220._0_8_ + 1));
                    }
                    local_230._0_8_ = local_220;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)local_230,local_298._M_unused._M_object,
                               local_298._8_8_ + (long)local_298._M_unused._0_8_);
                    std::__cxx11::string::append((char *)local_230);
                    local_210._8_8_ = 0;
                    local_210._M_unused._M_object = operator_new(0x18);
                    *(CodeWriter **)local_210._M_unused._0_8_ = local_258;
                    *(undefined1 **)((long)local_210._M_unused._0_8_ + 8) = local_140;
                    *(_Any_data **)((long)local_210._M_unused._0_8_ + 0x10) = &local_298;
                    pcStack_1f8 = std::
                                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1187:63)>
                                  ::_M_invoke;
                    local_200 = std::
                                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1187:63)>
                                ::_M_manager;
                    GenerateFunOneLine(local_258,(string *)&local_278,(string *)&local_250,
                                       (string *)local_230,(function<void_()> *)&local_210,false);
                    if (local_200 != (code *)0x0) {
                      (*local_200)(&local_210,&local_210,3);
                    }
                    std::operator+(&local_50,"obj: ",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_298);
                    plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
                    local_1a8._M_unused._M_object = &local_198;
                    pp_Var12 = (_Manager_type *)(plVar6 + 2);
                    if ((_Manager_type *)*plVar6 == pp_Var12) {
                      local_198 = *pp_Var12;
                      pcStack_190 = (code *)plVar6[3];
                    }
                    else {
                      local_198 = *pp_Var12;
                      local_1a8._M_unused._M_object = (_Manager_type *)*plVar6;
                    }
                    local_1a8._8_8_ = plVar6[1];
                    *plVar6 = (long)pp_Var12;
                    plVar6[1] = 0;
                    *(undefined1 *)(plVar6 + 2) = 0;
                    GenTypeGet_abi_cxx11_((string *)(local_140 + 0x48),local_1f0,&pVVar15->type);
                    p_Var14 = (_Manager_type)0xf;
                    if ((_Manager_type *)local_1a8._M_unused._0_8_ != &local_198) {
                      p_Var14 = local_198;
                    }
                    p_Var1 = (_Manager_type)
                             ((long)&((_Alloc_hider *)local_f8._8_8_)->_M_p + local_1a8._8_8_);
                    if (p_Var14 < p_Var1) {
                      p_Var14 = (_Manager_type)0xf;
                      if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
                        p_Var14 = (_Manager_type)local_f8._16_8_;
                      }
                      if (p_Var14 < p_Var1) goto LAB_001edeea;
                      plVar6 = (long *)std::__cxx11::string::replace
                                                 ((ulong)(local_140 + 0x48),0,(char *)0x0,
                                                  local_1a8._M_unused._M_member_pointer);
                    }
                    else {
LAB_001edeea:
                      plVar6 = (long *)std::__cxx11::string::_M_append
                                                 (local_1a8._M_pod_data,local_f8._0_8_);
                    }
                    local_210._M_unused._M_object = &local_200;
                    pCVar11 = (CodeWriter *)(plVar6 + 2);
                    if ((CodeWriter *)*plVar6 == pCVar11) {
                      local_200 = *(code **)&(pCVar11->value_map_)._M_t._M_impl;
                      pcStack_1f8 = (code *)plVar6[3];
                    }
                    else {
                      local_200 = *(code **)&(pCVar11->value_map_)._M_t._M_impl;
                      local_210._M_unused._M_object = (CodeWriter *)*plVar6;
                    }
                    local_210._8_8_ = plVar6[1];
                    *plVar6 = (long)pCVar11;
                    plVar6[1] = 0;
                    *(undefined1 *)&(pCVar11->value_map_)._M_t._M_impl = 0;
                    if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
                      operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
                    }
                    if ((_Manager_type *)local_1a8._M_unused._0_8_ != &local_198) {
                      operator_delete(local_1a8._M_unused._M_object,(ulong)(local_198 + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_50._M_dataplus._M_p != &local_50.field_2) {
                      operator_delete(local_50._M_dataplus._M_p,
                                      local_50.field_2._M_allocated_capacity + 1);
                    }
                    local_1a8._8_8_ = 0;
                    local_1a8._M_unused._M_object = operator_new(0x18);
                    *(CodeWriter **)local_1a8._M_unused._0_8_ = local_258;
                    *(undefined1 **)((long)local_1a8._M_unused._0_8_ + 8) = local_140;
                    *(_Any_data **)((long)local_1a8._M_unused._0_8_ + 0x10) = &local_298;
                    pcStack_190 = std::
                                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1196:63)>
                                  ::_M_invoke;
                    local_198 = std::
                                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1196:63)>
                                ::_M_manager;
                    GenerateFunOneLine(local_258,(string *)&local_278,(string *)&local_210,
                                       (string *)local_230,(function<void_()> *)&local_1a8,false);
                    if (local_198 != (_Manager_type)0x0) {
                      (*local_198)(&local_1a8,&local_1a8,__destroy_functor);
                    }
                    if ((CodeWriter *)local_210._M_unused._0_8_ != (CodeWriter *)&local_200) {
                      operator_delete(local_210._M_unused._M_object,(ulong)(local_200 + 1));
                    }
                    if ((undefined1 *)local_230._0_8_ != local_220) {
                      operator_delete((void *)local_230._0_8_,(ulong)(local_220._0_8_ + 1));
                    }
                    if ((CodeWriter *)local_250._M_unused._0_8_ != (CodeWriter *)local_240) {
                      operator_delete(local_250._M_unused._M_object,(ulong)(local_240._0_8_ + 1));
                    }
                    if ((CodeWriter *)local_278._M_p != (CodeWriter *)auStack_268) {
                      operator_delete(local_278._M_p,(ulong)(auStack_268._0_8_ + 1));
                    }
                    if ((CodeWriter *)local_298._M_unused._0_8_ != (CodeWriter *)&pEStack_288) {
                      operator_delete(local_298._M_unused._M_object,
                                      (ulong)((long)&(pEStack_288->super_Definition).name.
                                                     _M_dataplus._M_p + 1));
                    }
                    BVar9 = (field->value).type.element;
                    if (BVar9 - BASE_TYPE_UTYPE < 0xc) {
                      t = 1;
                      if (BVar2 == BASE_TYPE_STRING) goto LAB_001ee129;
                      goto LAB_001edb0c;
                    }
                    break;
                  }
                  ppFVar8 = ppFVar8 + 1;
                } while (ppFVar8 != ppFVar3);
                if (BVar2 == BASE_TYPE_STRING) goto LAB_001ee11f;
              }
            }
          }
          else if (BVar9 - BASE_TYPE_UTYPE < 0xc) {
LAB_001edb0c:
            local_278._M_p._4_4_ = 0;
            local_278._M_p._0_4_ = BVar9;
            local_270 = (field->value).type.struct_def;
            auStack_268._0_8_ = (field->value).type.enum_def;
            auStack_268._8_2_ = (field->value).type.fixed_length;
            t = InlineSize((Type *)&local_278);
LAB_001ee129:
            NumToString<unsigned_long>((string *)&local_298,t);
            local_278._M_p = (pointer)auStack_268;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_278,local_1c8._M_dataplus._M_p,
                       (long)(_Rb_tree_color *)local_1c8._M_string_length +
                       local_1c8._M_dataplus._M_p);
            std::__cxx11::string::append((char *)&local_278);
            local_250._M_unused._M_object = local_240;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"");
            local_230._0_8_ = local_220;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"ReadBuffer","");
            local_210._M_unused._M_object = local_258;
            pcStack_1f8 = std::
                          _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1222:64)>
                          ::_M_invoke;
            local_200 = std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1222:64)>
                        ::_M_manager;
            local_210._8_8_ = &local_298;
            GenerateFunOneLine(local_258,(string *)&local_278,(string *)&local_250,
                               (string *)local_230,(function<void_()> *)&local_210,false);
            if (local_200 != (code *)0x0) {
              (*local_200)(&local_210,&local_210,3);
            }
            if ((undefined1 *)local_230._0_8_ != local_220) {
              operator_delete((void *)local_230._0_8_,(ulong)(local_220._0_8_ + 1));
            }
            if ((CodeWriter *)local_250._M_unused._0_8_ != (CodeWriter *)local_240) {
              operator_delete(local_250._M_unused._M_object,(ulong)(local_240._0_8_ + 1));
            }
            if ((CodeWriter *)local_278._M_p != (CodeWriter *)auStack_268) {
              operator_delete(local_278._M_p,(ulong)(auStack_268._0_8_ + 1));
            }
            goto LAB_001ee269;
          }
        }
        else {
          if (BVar2 != BASE_TYPE_STRUCT) {
            if (0xb < BVar2 - BASE_TYPE_UTYPE) {
              switch(BVar2) {
              case BASE_TYPE_STRING:
                local_298._M_unused._M_object = local_258;
                local_298._8_8_ = local_140;
                local_280 = std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1104:68)>
                            ::_M_invoke;
                pEStack_288 = (EnumDef *)
                              std::
                              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1104:68)>
                              ::_M_manager;
                GenerateGetterOneLine
                          (local_258,(string *)(local_1d8 + 0x10),(string *)&local_188,
                           (function<void_()> *)&local_298);
                if (pEStack_288 != (EnumDef *)0x0) {
                  (*(code *)pEStack_288)(&local_298,&local_298,3);
                }
LAB_001ee11f:
                t = 1;
                goto LAB_001ee129;
              case BASE_TYPE_VECTOR:
                goto switchD_001ed71b_caseD_e;
              case BASE_TYPE_STRUCT:
                goto switchD_001ed71b_caseD_f;
              case BASE_TYPE_UNION:
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_298,"obj: ",&local_168);
                local_270 = (StructDef *)0x0;
                local_278._M_p = (pointer)operator_new(0x18);
                *(CodeWriter **)&(((CodeWriter *)local_278._M_p)->value_map_)._M_t._M_impl =
                     local_258;
                *(undefined1 **)
                 &(((CodeWriter *)local_278._M_p)->value_map_)._M_t._M_impl.super__Rb_tree_header.
                  _M_header = local_140;
                (((CodeWriter *)local_278._M_p)->value_map_)._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_parent = (_Base_ptr)&local_b0;
                auStack_268._8_8_ =
                     std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1160:72)>
                     ::_M_invoke;
                auStack_268._0_8_ =
                     std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1160:72)>
                     ::_M_manager;
                GenerateFunOneLine(local_258,(string *)(local_1d8 + 0x10),(string *)&local_298,
                                   (string *)&local_188,(function<void_()> *)&local_278,false);
                if ((EnumDef *)auStack_268._0_8_ != (EnumDef *)0x0) {
                  (*(code *)auStack_268._0_8_)((string *)&local_278,(string *)&local_278,3);
                }
                goto LAB_001ee269;
              default:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp"
                              ,0x48d,
                              "void flatbuffers::kotlin::KotlinKMPGenerator::GenerateStructGetters(StructDef &, CodeWriter &) const"
                             );
              }
            }
            if (local_148->fixed == true) {
              local_298._8_8_ = (StructDef *)0x0;
              local_298._M_unused._M_object = operator_new(0x18);
              *(CodeWriter **)&(((CodeWriter *)local_298._M_unused._0_8_)->value_map_)._M_t._M_impl
                   = local_258;
              *(KotlinKMPGenerator **)
               &(((CodeWriter *)local_298._M_unused._0_8_)->value_map_)._M_t._M_impl.
                super__Rb_tree_header._M_header = local_1f0;
              (((CodeWriter *)local_298._M_unused._0_8_)->value_map_)._M_t._M_impl.
              super__Rb_tree_header._M_header._M_parent = (_Base_ptr)field;
              local_280 = std::
                          _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1049:66)>
                          ::_M_invoke;
              pEStack_288 = (EnumDef *)
                            std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1049:66)>
                            ::_M_manager;
              GenerateGetterOneLine
                        (local_258,(string *)(local_1d8 + 0x10),(string *)&local_188,
                         (function<void_()> *)&local_298);
              if (pEStack_288 != (EnumDef *)0x0) {
                (*(code *)pEStack_288)(&local_298,&local_298,3);
              }
            }
            else {
              local_298._8_8_ = (StructDef *)0x0;
              local_298._M_unused._M_object = operator_new(0x20);
              *(CodeWriter **)&(((CodeWriter *)local_298._M_unused._0_8_)->value_map_)._M_t._M_impl
                   = local_258;
              *(undefined1 **)
               &(((CodeWriter *)local_298._M_unused._0_8_)->value_map_)._M_t._M_impl.
                super__Rb_tree_header._M_header = local_140;
              (((CodeWriter *)local_298._M_unused._0_8_)->value_map_)._M_t._M_impl.
              super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_1f0;
              (((CodeWriter *)local_298._M_unused._0_8_)->value_map_)._M_t._M_impl.
              super__Rb_tree_header._M_header._M_left = (_Base_ptr)field;
              local_280 = std::
                          _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1054:66)>
                          ::_M_invoke;
              pEStack_288 = (EnumDef *)
                            std::
                            _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1054:66)>
                            ::_M_manager;
              GenerateGetterOneLine
                        (local_258,(string *)(local_1d8 + 0x10),(string *)&local_188,
                         (function<void_()> *)&local_298);
              if (pEStack_288 != (EnumDef *)0x0) {
                (*(code *)pEStack_288)(&local_298,&local_298,3);
              }
            }
            goto LAB_001ee27f;
          }
          local_298._8_8_ = (StructDef *)0x0;
          local_298._M_unused._M_object = local_258;
          local_280 = std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1034:64)>
                      ::_M_invoke;
          pEStack_288 = (EnumDef *)
                        std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1034:64)>
                        ::_M_manager;
          GenerateGetterOneLine
                    (local_258,(string *)(local_1d8 + 0x10),(string *)&local_188,
                     (function<void_()> *)&local_298);
          if (pEStack_288 != (EnumDef *)0x0) {
            (*(code *)pEStack_288)(&local_298,&local_298,3);
          }
switchD_001ed71b_caseD_f:
          if (local_148->fixed == true) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_298,"obj: ",&local_168);
            local_270 = (StructDef *)0x0;
            local_278._M_p = (pointer)local_258;
            auStack_268._8_8_ =
                 std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1070:74)>
                 ::_M_invoke;
            auStack_268._0_8_ =
                 std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1070:74)>
                 ::_M_manager;
            GenerateFunOneLine(local_258,(string *)(local_1d8 + 0x10),(string *)&local_298,
                               (string *)&local_188,(function<void_()> *)&local_278,false);
            if ((EnumDef *)auStack_268._0_8_ != (EnumDef *)0x0) {
              (*(code *)auStack_268._0_8_)((string *)&local_278,(string *)&local_278,3);
            }
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_298,"obj: ",&local_168);
            local_270 = (StructDef *)0x0;
            local_278._M_p = (pointer)operator_new(0x18);
            *(FieldDef **)&(((CodeWriter *)local_278._M_p)->value_map_)._M_t._M_impl = field;
            *(CodeWriter **)
             &(((CodeWriter *)local_278._M_p)->value_map_)._M_t._M_impl.super__Rb_tree_header.
              _M_header = local_258;
            (((CodeWriter *)local_278._M_p)->value_map_)._M_t._M_impl.super__Rb_tree_header.
            _M_header._M_parent = (_Base_ptr)local_140;
            auStack_268._8_8_ =
                 std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1086:74)>
                 ::_M_invoke;
            auStack_268._0_8_ =
                 std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1086:74)>
                 ::_M_manager;
            GenerateFunOneLine(local_258,(string *)(local_1d8 + 0x10),(string *)&local_298,
                               (string *)&local_188,(function<void_()> *)&local_278,false);
            if ((EnumDef *)auStack_268._0_8_ != (EnumDef *)0x0) {
              (*(code *)auStack_268._0_8_)((string *)&local_278,(string *)&local_278,3);
            }
          }
LAB_001ee269:
          if ((CodeWriter *)local_298._M_unused._0_8_ != (CodeWriter *)&pEStack_288) {
            operator_delete(local_298._M_unused._M_object,
                            (ulong)((long)&(pEStack_288->super_Definition).name._M_dataplus._M_p + 1
                                   ));
          }
        }
LAB_001ee27f:
        pSVar5 = field->nested_flatbuffer;
        if (pSVar5 != (StructDef *)0x0) {
          local_278._M_p = (pointer)auStack_268;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"");
          TypeInNameSpace((string *)&local_298,local_1f0,&pSVar5->super_Definition,
                          (string *)&local_278);
          if ((CodeWriter *)local_278._M_p != (CodeWriter *)auStack_268) {
            operator_delete(local_278._M_p,(ulong)(auStack_268._0_8_ + 1));
          }
          local_250._M_unused._M_object = local_240;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_250,local_1c8._M_dataplus._M_p,
                     (long)(_Rb_tree_color *)local_1c8._M_string_length + local_1c8._M_dataplus._M_p
                    );
          std::__cxx11::string::append(local_250._M_pod_data);
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     (local_250._M_pod_data,
                                      (ulong)(field->nested_flatbuffer->super_Definition).name.
                                             _M_dataplus._M_p);
          pCVar11 = (CodeWriter *)(plVar6 + 2);
          if ((CodeWriter *)*plVar6 == pCVar11) {
            auStack_268._0_8_ = *(undefined8 *)&(pCVar11->value_map_)._M_t._M_impl;
            auStack_268._8_8_ = plVar6[3];
            local_278._M_p = (pointer)auStack_268;
          }
          else {
            auStack_268._0_8_ = *(undefined8 *)&(pCVar11->value_map_)._M_t._M_impl;
            local_278._M_p = (pointer)*plVar6;
          }
          local_270 = (StructDef *)plVar6[1];
          *plVar6 = (long)pCVar11;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if ((CodeWriter *)local_250._M_unused._0_8_ != (CodeWriter *)local_240) {
            operator_delete(local_250._M_unused._M_object,(ulong)(local_240._0_8_ + 1));
          }
          local_250._M_unused._M_object = (CodeWriter *)local_240;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_250,local_298._M_unused._M_object,
                     local_298._8_8_ + (long)local_298._M_unused._0_8_);
          std::__cxx11::string::append(local_250._M_pod_data);
          local_230._8_8_ = (_Base_ptr)0x0;
          local_230._0_8_ = operator_new(0x18);
          *(CodeWriter **)local_230._0_8_ = local_258;
          *(string **)(local_230._0_8_ + 8) = (string *)&local_278;
          *(_Any_data **)(local_230._0_8_ + 0x10) = &local_298;
          local_220._8_8_ =
               std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1238:65)>
               ::_M_invoke;
          local_220._0_8_ =
               std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1238:65)>
               ::_M_manager;
          GenerateGetterOneLine
                    (local_258,(string *)&local_278,(string *)&local_250,
                     (function<void_()> *)local_230);
          if ((code *)local_220._0_8_ != (code *)0x0) {
            (*(code *)local_220._0_8_)((string *)local_230,(string *)local_230,3);
          }
          if ((CodeWriter *)local_250._M_unused._0_8_ != (CodeWriter *)local_240) {
            operator_delete(local_250._M_unused._M_object,(ulong)(local_240._0_8_ + 1));
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_250,"obj: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_298);
          local_230._0_8_ = local_220;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_230,local_298._M_unused._M_object,
                     local_298._8_8_ + (long)local_298._M_unused._0_8_);
          std::__cxx11::string::append((char *)local_230);
          local_210._M_unused._M_object = local_258;
          pcStack_1f8 = std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1244:37)>
                        ::_M_invoke;
          local_200 = std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1244:37)>
                      ::_M_manager;
          local_210._8_8_ = local_140;
          GenerateFunOneLine(local_258,(string *)&local_278,(string *)&local_250,(string *)local_230
                             ,(function<void_()> *)&local_210,false);
          if (local_200 != (code *)0x0) {
            (*local_200)(&local_210,&local_210,3);
          }
          if ((undefined1 *)local_230._0_8_ != local_220) {
            operator_delete((void *)local_230._0_8_,(ulong)(local_220._0_8_ + 1));
          }
          if ((CodeWriter *)local_250._M_unused._0_8_ != (CodeWriter *)local_240) {
            operator_delete(local_250._M_unused._M_object,(ulong)(local_240._0_8_ + 1));
          }
          if ((CodeWriter *)local_278._M_p != (CodeWriter *)auStack_268) {
            operator_delete(local_278._M_p,(ulong)(auStack_268._0_8_ + 1));
          }
          if ((CodeWriter *)local_298._M_unused._0_8_ != (CodeWriter *)&pEStack_288) {
            operator_delete(local_298._M_unused._M_object,
                            (ulong)((long)&(pEStack_288->super_Definition).name._M_dataplus._M_p + 1
                                   ));
          }
        }
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
        CodeWriter::operator+=(local_258,&local_70);
        psVar13 = local_90;
        this = local_1f0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,
                          (ulong)(local_70.field_2._M_allocated_capacity + 1));
        }
        if (local_1e8 != (_Base_ptr)local_1d8) {
          operator_delete(local_1e8,local_1d8._0_8_ + 1);
        }
        if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
          operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_p != &local_a0) {
          operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
        }
        if ((code **)local_188._M_unused._0_8_ != &local_178) {
          operator_delete(local_188._M_unused._M_object,(ulong)(local_178 + 1));
        }
        if (local_120._M_dataplus._M_p != local_140 + 0x30) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
      }
      psVar13 = (string *)&psVar13->_M_string_length;
    } while (psVar13 != (string *)local_88._8_8_);
  }
  if ((local_148->has_key != false) && (local_148->fixed == false)) {
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_1d8 + 0x10),"keysCompare","");
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_168,"o1: Offset<*>, o2: Offset<*>, buffer: ReadWriteBuffer","");
    local_120._M_dataplus._M_p = local_140 + 0x30;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_140 + 0x20),"Int","");
    local_188._8_8_ = 0;
    local_188._M_unused._M_object = operator_new(0x18);
    *(FieldDef ***)local_188._M_unused._0_8_ = &local_d8;
    *(CodeWriter **)((long)local_188._M_unused._0_8_ + 8) = local_258;
    *(KotlinKMPGenerator **)((long)local_188._M_unused._0_8_ + 0x10) = this;
    local_170 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1257:11)>
                ::_M_invoke;
    local_178 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1257:11)>
                ::_M_manager;
    GenerateOverrideFun(local_258,(string *)(local_1d8 + 0x10),&local_168,
                        (string *)(local_140 + 0x20),(function<void_()> *)&local_188);
    if (local_178 != (code *)0x0) {
      (*local_178)(&local_188,&local_188,3);
    }
    if (local_120._M_dataplus._M_p != local_140 + 0x30) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((string *)local_88._0_8_ != (string *)0x0) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ - local_88._0_8_);
  }
  return;
}

Assistant:

void GenerateStructGetters(StructDef &struct_def, CodeWriter &writer) const {
    auto fields_vec = struct_def.fields.vec;
    FieldDef *key_field = nullptr;
    for (auto it = fields_vec.begin(); it != fields_vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      if (field.key) key_field = &field;

      GenerateComment(field.doc_comment, writer, &comment_config);

      auto field_name = namer_.Field(field);
      auto field_type = GenTypeGet(field.value.type);
      auto field_default_value = GenDefaultValue(field);
      auto return_type = GetterReturnType(field);
      auto bbgetter = ByteBufferGetter(field.value.type, "bb");
      auto offset_val = NumToString(field.value.offset);
      auto offset_prefix =
          "val o = offset(" + offset_val + "); return o != 0 ? ";
      auto value_base_type = field.value.type.base_type;
      // Most field accessors need to retrieve and test the field offset
      // first, this is the offset value for that:
      writer.SetValue("offset", NumToString(field.value.offset));
      writer.SetValue("return_type", return_type);
      writer.SetValue("field_type", field_type);
      writer.SetValue("field_name", field_name);
      writer.SetValue("field_default", field_default_value);
      writer.SetValue("bbgetter", bbgetter);
      // Generate the accessors that don't do object reuse.
      if (value_base_type == BASE_TYPE_STRUCT) {
        // Calls the accessor that takes an accessor object with a
        // new object.
        // val pos
        //     get() = pos(Vec3())
        GenerateGetterOneLine(writer, field_name, return_type, [&]() {
          writer += "{{field_name}}({{field_type}}())";
        });
      } else if (value_base_type == BASE_TYPE_VECTOR &&
                 field.value.type.element == BASE_TYPE_STRUCT) {
        // Accessors for vectors of structs also take accessor objects,
        // this generates a variant without that argument.
        // ex: fun weapons(j: Int) = weapons(Weapon(), j)
        GenerateFunOneLine(writer, field_name, "j: Int", return_type, [&]() {
          writer += "{{field_name}}({{field_type}}(), j)";
        });
      }

      if (IsScalar(value_base_type)) {
        if (struct_def.fixed) {
          GenerateGetterOneLine(writer, field_name, return_type, [&]() {
            std::string found = "{{bbgetter}}(bufferPos + {{offset}})";
            writer += WrapEnumValue(field.value.type, found);
          });
        } else {
          GenerateGetterOneLine(writer, field_name, return_type, [&]() {
            std::string found = "{{bbgetter}}(it + bufferPos)";
            writer += LookupFieldOneLine(offset_val,
                                         WrapEnumValue(field.value.type, found),
                                         "{{field_default}}");
          });
        }
      } else {
        switch (value_base_type) {
          case BASE_TYPE_STRUCT:
            if (struct_def.fixed) {
              // create getter with object reuse
              // ex:
              // fun pos(obj: Vec3) : Vec3? = obj.init(bufferPos + 4, bb)
              // ? adds nullability annotation
              GenerateFunOneLine(
                  writer, field_name, "obj: " + field_type, return_type, [&]() {
                    writer += "obj.init(bufferPos + {{offset}}, bb)";
                  });
            } else {
              // create getter with object reuse
              // ex:
              //  fun pos(obj: Vec3) : Vec3? {
              //      val o = offset(4)
              //      return if(o != 0) {
              //          obj.init(o + bufferPos, bb)
              //      else {
              //          null
              //      }
              //  }
              // ? adds nullability annotation
              GenerateFunOneLine(
                  writer, field_name, "obj: " + field_type, return_type, [&]() {
                    auto fixed = field.value.type.struct_def->fixed;

                    writer.SetValue("seek", Indirect("it + bufferPos", fixed));
                    writer += LookupFieldOneLine(
                        offset_val, "obj.init({{seek}}, bb)", "null");
                  });
            }
            break;
          case BASE_TYPE_STRING:
            // create string getter
            // e.g.
            // val Name : String?
            //     get() = {
            //         val o = offset(10)
            //         return if (o != 0) string(o + bufferPos) else null
            //     }
            // ? adds nullability annotation
            GenerateGetterOneLine(writer, field_name, return_type, [&]() {
              writer += LookupFieldOneLine(offset_val, "string(it + bufferPos)",
                                           "null");
            });
            break;
          case BASE_TYPE_VECTOR: {
            // e.g.
            // fun inventory(j: Int) : UByte {
            //     val o = offset(14)
            //     return if (o != 0) {
            //         bb.get(vector(it) + j * 1).toUByte()
            //     } else {
            //        0
            //     }
            // }

            auto vectortype = field.value.type.VectorType();
            std::string params = "j: Int";

            if (vectortype.base_type == BASE_TYPE_STRUCT ||
                vectortype.base_type == BASE_TYPE_UNION) {
              params = "obj: " + field_type + ", j: Int";
            }

            GenerateFunOneLine(writer, field_name, params, return_type, [&]() {
              auto inline_size = NumToString(InlineSize(vectortype));
              auto index = "vector(it) + j * " + inline_size;
              std::string found = "";
              writer.SetValue("index", index);

              if (IsEnum(vectortype)) {
                found = "{{field_type}}({{bbgetter}}({{index}}))";
              } else {
                switch (vectortype.base_type) {
                  case BASE_TYPE_STRUCT: {
                    bool fixed = vectortype.struct_def->fixed;
                    writer.SetValue("index", Indirect(index, fixed));
                    found = "obj.init({{index}}, bb)";
                    break;
                  }
                  case BASE_TYPE_UNION:
                    found = "{{bbgetter}}(obj, {{index}})";
                    break;
                  case BASE_TYPE_UTYPE:
                    found = "{{field_type}}({{bbgetter}}({{index}}))";
                    break;
                  default: found = "{{bbgetter}}({{index}})";
                }
              }
              writer +=
                  LookupFieldOneLine(offset_val, found, "{{field_default}}");
            });
            break;
          }
          case BASE_TYPE_UNION:
            GenerateFunOneLine(
                writer, field_name, "obj: " + field_type, return_type, [&]() {
                  writer += LookupFieldOneLine(
                      offset_val, bbgetter + "(obj, it + bufferPos)", "null");
                });
            break;
          default: FLATBUFFERS_ASSERT(0);
        }
      }

      if (value_base_type == BASE_TYPE_VECTOR) {
        // Generate Lenght functions for vectors
        GenerateGetterOneLine(writer, field_name + "Length", "Int", [&]() {
          writer += LookupFieldOneLine(offset_val, "vectorLength(it)", "0");
        });

        // See if we should generate a by-key accessor.
        if (field.value.type.element == BASE_TYPE_STRUCT &&
            !field.value.type.struct_def->fixed) {
          auto &sd = *field.value.type.struct_def;
          auto &fields = sd.fields.vec;
          for (auto kit = fields.begin(); kit != fields.end(); ++kit) {
            auto &kfield = **kit;
            if (kfield.key) {
              auto qualified_name = TypeInNameSpace(sd);
              auto name = namer_.Method(field, "ByKey");
              auto params = "key: " + GenTypeGet(kfield.value.type);
              auto rtype = qualified_name + "?";
              GenerateFunOneLine(writer, name, params, rtype, [&]() {
                writer += LookupFieldOneLine(
                    offset_val,
                    qualified_name + ".lookupByKey(null, vector(it), key, bb)",
                    "null");
              });

              auto param2 = "obj: " + qualified_name +
                            ", key: " + GenTypeGet(kfield.value.type);
              GenerateFunOneLine(writer, name, param2, rtype, [&]() {
                writer += LookupFieldOneLine(
                    offset_val,
                    qualified_name + ".lookupByKey(obj, vector(it), key, bb)",
                    "null");
              });

              break;
            }
          }
        }
      }

      if ((value_base_type == BASE_TYPE_VECTOR &&
           IsScalar(field.value.type.VectorType().base_type)) ||
          value_base_type == BASE_TYPE_STRING) {
        auto end_idx =
            NumToString(value_base_type == BASE_TYPE_STRING
                            ? 1
                            : InlineSize(field.value.type.VectorType()));

        // Generate a ByteBuffer accessor for strings & vectors of scalars.
        // e.g.
        // fun inventoryInByteBuffer(buffer: Bytebuffer):
        //     ByteBuffer = vectorAsBuffer(buffer, 14, 1)
        GenerateFunOneLine(
            writer, field_name + "AsBuffer", "", "ReadBuffer", [&]() {
              writer.SetValue("end", end_idx);
              writer += "vectorAsBuffer(bb, {{offset}}, {{end}})";
            });
      }

      // generate object accessors if is nested_flatbuffer
      // fun testnestedflatbufferAsMonster() : Monster?
      //{ return testnestedflatbufferAsMonster(new Monster()); }

      if (field.nested_flatbuffer) {
        auto nested_type_name = TypeInNameSpace(*field.nested_flatbuffer);
        auto nested_method_name =
            field_name + "As" + field.nested_flatbuffer->name;

        GenerateGetterOneLine(
            writer, nested_method_name, nested_type_name + "?", [&]() {
              writer += nested_method_name + "(" + nested_type_name + "())";
            });

        GenerateFunOneLine(
            writer, nested_method_name, "obj: " + nested_type_name,
            nested_type_name + "?", [&]() {
              writer += LookupFieldOneLine(
                  offset_val, "obj.init(indirect(vector(it)), bb)", "null");
            });
      }

      writer += "";  // Initial line break between fields
    }
    if (struct_def.has_key && !struct_def.fixed) {
      // Key Comparison method
      GenerateOverrideFun(
          writer, "keysCompare",
          "o1: Offset<*>, o2: Offset<*>, buffer: ReadWriteBuffer", "Int",
          [&]() {
            if (IsString(key_field->value.type)) {
              writer.SetValue("offset", NumToString(key_field->value.offset));
              writer +=
                  " return compareStrings(offset({{offset}}, o1, "
                  "buffer), offset({{offset}}, o2, buffer), buffer)";

            } else {
              auto getter1 = GenLookupByKey(key_field, "buffer", "o1");
              auto getter2 = GenLookupByKey(key_field, "buffer", "o2");
              writer += "val a = " + getter1;
              writer += "val b = " + getter2;
              writer += "return (a - b).toInt().sign()";
            }
          });
    }
  }